

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O1

int Ssw_CnfGetNodeValue(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int in_EDX;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswCnf.c"
                  ,0x195,"int Ssw_CnfGetNodeValue(Ssw_Sat_t *, Aig_Obj_t *)");
  }
  p_00 = p->vSatVars;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(p_00,iVar1 + 1,in_EDX);
  if ((-1 < (long)iVar1) && (iVar1 < p_00->nSize)) {
    iVar1 = p_00->pArray[iVar1];
    if ((long)iVar1 < 1) {
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar4 = 0;
      if ((uVar2 & 7) != 2) {
        if ((uVar2 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswCnf.c"
                        ,0x19d,"int Ssw_CnfGetNodeValue(Ssw_Sat_t *, Aig_Obj_t *)");
        }
        uVar2 = Ssw_CnfGetNodeValue(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
        uVar4 = *(uint *)&pObj->pFanin0;
        uVar3 = Ssw_CnfGetNodeValue(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
        uVar4 = (*(uint *)&pObj->pFanin1 & 1 ^ uVar3) & (uVar2 ^ uVar4);
      }
    }
    else {
      if (p->pSat->size <= iVar1) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      uVar4 = (uint)(p->pSat->model[iVar1] == 1);
    }
    return uVar4;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Ssw_CnfGetNodeValue( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    int Value0, Value1, nVarNum;
    assert( !Aig_IsComplement(pObj) );
    nVarNum = Ssw_ObjSatNum( p, pObj );
    if ( nVarNum > 0 )
        return sat_solver_var_value( p->pSat, nVarNum );
//    if ( pObj->fMarkA == 1 )
//        return 0;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    assert( Aig_ObjIsNode(pObj) );
    Value0 = Ssw_CnfGetNodeValue( p, Aig_ObjFanin0(pObj) );
    Value0 ^= Aig_ObjFaninC0(pObj);
    Value1 = Ssw_CnfGetNodeValue( p, Aig_ObjFanin1(pObj) );
    Value1 ^= Aig_ObjFaninC1(pObj);
    return Value0 & Value1;
}